

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

void __thiscall Helper::GenerateCorrelatedRandoms(Helper *this,int n)

{
  ulong uVar1;
  int iVar2;
  time_t tVar3;
  ostream *poVar4;
  size_type __n;
  ulong uVar5;
  long local_288;
  ofstream fout;
  ios_base local_190 [264];
  time_t local_88;
  time_t t;
  vector<long,_std::allocator<long>_> R;
  vector<long,_std::allocator<long>_> R1;
  vector<long,_std::allocator<long>_> R2;
  
  uVar1 = (ulong)(uint)n;
  __n = (size_type)n;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &R.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__n,(allocator_type *)&local_288);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__n,(allocator_type *)&local_288);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&t,__n,(allocator_type *)&local_288);
  std::ofstream::ofstream(&local_288);
  tVar3 = time(&local_88);
  srand((uint)tVar3);
  if (0 < n) {
    uVar5 = 0;
    do {
      iVar2 = rand();
      R.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage[uVar5] = (long)(iVar2 % 10000);
      iVar2 = rand();
      R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage[uVar5] = (long)(iVar2 % 10000);
      iVar2 = rand();
      *(long *)(t + uVar5 * 8) = (long)(iVar2 % 10000);
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  std::ofstream::open((char *)&local_288,0x105014);
  if (0 < n) {
    uVar5 = 0;
    do {
      poVar4 = std::ostream::_M_insert<long>((long)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::ostream::_M_insert<long>((long)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  std::ostream::flush();
  std::ofstream::close();
  std::ofstream::open((char *)&local_288,0x105035);
  if (0 < n) {
    uVar5 = 0;
    do {
      poVar4 = std::ostream::_M_insert<long>((long)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::ostream::_M_insert<long>((long)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  std::ostream::flush();
  std::ofstream::close();
  local_288 = _VTT;
  *(undefined8 *)((long)&local_288 + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&fout);
  std::ios_base::~ios_base(local_190);
  if (t != 0) {
    operator_delete((void *)t,
                    (long)R.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish - t);
  }
  if (R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)R2.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (R.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(R.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)R1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)R.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void Helper::GenerateCorrelatedRandoms(int n)
{
    std::vector<long> R1(n);
    std::vector<long> R2(n);
    std::vector<long> R(n);
    std::ofstream fout;
    time_t t;
    srand((unsigned)time(&t));

    for (int i = 0; i < n; i++)
    {
        R1[i] = rand()%10000;
        R2[i] = rand()%10000;
        R[i] = rand()%10000;
    }
    fout.open("../randoms/alice/Randoms_A.txt");
    for (int i = 0; i < n; i++)
    {
        fout << R1[i] << " ";
        fout << R1[i] * R2[i] + R[i] << "\n";
    }
    fout.flush();
    fout.close();
    fout.open("../randoms/bob/Randoms_B.txt");
    for (int i = 0; i < n; i++)
    {
        fout << R2[i] << " ";
        fout << R1[i] * R2[i] - R[i] << "\n";
    }
    fout.flush();
    fout.close();
}